

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O3

void glu::initCoreFunctions(Functions *dst,FunctionLoader *loader,ApiType apiType)

{
  long lVar1;
  InternalError *this;
  ApiType local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_84.m_bits = apiType.m_bits;
  if (initCoreFunctions(glw::Functions*,glw::FunctionLoader_const*,glu::ApiType)::s_initFuncs ==
      '\0') {
    initCoreFunctions();
  }
  lVar1 = 8;
  do {
    if (*(deUint32 *)(lVar1 + 0x3f7698) == local_84.m_bits) {
      (**(code **)((long)&initCoreFunctions::s_initFuncs[0].apiType.m_bits + lVar1))(dst,loader);
      return;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xe8);
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Don\'t know how to load functions for ","");
  de::toString<glu::ApiType>(&local_60,&local_84);
  std::operator+(&local_40,&local_80,&local_60);
  tcu::InternalError::InternalError(this,&local_40);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void initCoreFunctions (glw::Functions* dst, const glw::FunctionLoader* loader, ApiType apiType)
{
	static const struct
	{
		ApiType		apiType;
		void		(*initFunc)		(glw::Functions* gl, const glw::FunctionLoader* loader);
	} s_initFuncs[] =
	{
		{ ApiType::es(2,0),		glw::initES20		},
		{ ApiType::es(3,0),		glw::initES30		},
		{ ApiType::es(3,1),		glw::initES31		},
		{ ApiType::es(3,2),		glw::initES32		},
		{ ApiType::core(3,0),	glw::initGL30Core	},
		{ ApiType::core(3,1),	glw::initGL31Core	},
		{ ApiType::core(3,2),	glw::initGL32Core	},
		{ ApiType::core(3,3),	glw::initGL33Core	},
		{ ApiType::core(4,0),	glw::initGL40Core	},
		{ ApiType::core(4,1),	glw::initGL41Core	},
		{ ApiType::core(4,2),	glw::initGL42Core	},
		{ ApiType::core(4,3),	glw::initGL43Core	},
		{ ApiType::core(4,4),	glw::initGL44Core	},
		{ ApiType::core(4,5),	glw::initGL45Core	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_initFuncs); ndx++)
	{
		if (s_initFuncs[ndx].apiType == apiType)
		{
			s_initFuncs[ndx].initFunc(dst, loader);
			return;
		}
	}

	throw tcu::InternalError(std::string("Don't know how to load functions for ") + de::toString(apiType));
}